

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d25b::VectorMerge<long_double>::VectorMerge
          (VectorMerge<long_double> *this,int insert_point,int input_length,int insert_length,
          bool recursive,bool overwrite_mode,istream *insert_stream)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000081;
  int iVar3;
  undefined7 in_register_00000089;
  
  (this->super_VectorMergeInterface)._vptr_VectorMergeInterface =
       (_func_int **)&PTR__VectorMerge_00115cb8;
  this->insert_point_ = insert_point;
  this->input_length_ = input_length;
  this->insert_length_ = insert_length;
  iVar2 = 0;
  iVar3 = insert_length;
  if ((int)CONCAT71(in_register_00000089,overwrite_mode) == 0) {
    iVar3 = 0;
    iVar2 = insert_length;
  }
  this->merged_length_ = iVar2 + input_length;
  this->input_rest_length_ = (iVar2 + input_length) - (insert_point + insert_length);
  this->input_skip_length_ = iVar3;
  this->recursive_ = recursive;
  this->has_vector_ = false;
  (this->insert_vector_).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->insert_vector_).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->insert_vector_).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((int)CONCAT71(in_register_00000081,recursive) != 0) &&
     (bVar1 = sptk::ReadStream<long_double>
                        (false,0,0,insert_length,&this->insert_vector_,insert_stream,(int *)0x0),
     bVar1)) {
    this->has_vector_ = true;
  }
  return;
}

Assistant:

VectorMerge(int insert_point, int input_length, int insert_length,
              bool recursive, bool overwrite_mode,
              std::istream* insert_stream = NULL)
      : insert_point_(insert_point),
        input_length_(input_length),
        insert_length_(insert_length),
        merged_length_(overwrite_mode ? input_length_
                                      : input_length_ + insert_length_),
        input_rest_length_(merged_length_ - insert_point_ - insert_length_),
        input_skip_length_(overwrite_mode ? insert_length_ : 0),
        recursive_(recursive),
        has_vector_(false) {
    if (recursive_ && sptk::ReadStream(false, 0, 0, insert_length_,
                                       &insert_vector_, insert_stream, NULL)) {
      has_vector_ = true;
    }
  }